

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

int getMessageColor(MessageType t)

{
  MessageType t_local;
  
  if (t != AUTHOR_WARNING) {
    if (t - AUTHOR_ERROR < 3) {
      return 2;
    }
    if (t != WARNING) {
      return 0;
    }
  }
  return 4;
}

Assistant:

static int getMessageColor(MessageType t)
{
  switch (t) {
    case MessageType::INTERNAL_ERROR:
    case MessageType::FATAL_ERROR:
    case MessageType::AUTHOR_ERROR:
      return cmsysTerminal_Color_ForegroundRed;
    case MessageType::AUTHOR_WARNING:
    case MessageType::WARNING:
      return cmsysTerminal_Color_ForegroundYellow;
    default:
      return cmsysTerminal_Color_Normal;
  }
}